

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<int>(void)

{
  ComparisonTestTU<int,char>();
  ComparisonTestTU<int,signed_char>();
  ComparisonTestTU<int,unsigned_char>();
  ComparisonTestTU<int,short>();
  ComparisonTestTU<int,unsigned_short>();
  ComparisonTestTU<int,int>();
  ComparisonTestTU<int,unsigned_int>();
  ComparisonTestTU<int,long>();
  ComparisonTestTU<int,unsigned_long>();
  ComparisonTestTU<int,long_long>();
  ComparisonTestTU<int,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}